

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O1

void * __thiscall CRingBufferBase::Prev(CRingBufferBase *this,void *pCurrent)

{
  CItem **ppCVar1;
  CItem *pCVar2;
  
  pCVar2 = (CItem *)((long)pCurrent + -0x18);
  while( true ) {
    ppCVar1 = &pCVar2->m_pPrev;
    pCVar2 = *ppCVar1;
    if (*ppCVar1 == (CItem *)0x0) {
      pCVar2 = this->m_pLast;
    }
    if (pCVar2 == this->m_pProduce) break;
    if (pCVar2->m_Free == 0) {
      return pCVar2 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *CRingBufferBase::Prev(void *pCurrent)
{
	CItem *pItem = ((CItem *)pCurrent) - 1;

	while(1)
	{
		pItem = PrevBlock(pItem);
		if(pItem == m_pProduce)
			return 0;
		if(!pItem->m_Free)
			return pItem+1;
	}
}